

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::ComputeLinkClosure(cmGeneratorTarget *this,string *config,LinkClosure *lc)

{
  cmTarget *pcVar1;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  byte local_2e3;
  byte local_2c1;
  string local_298;
  undefined1 local_278 [8];
  ostringstream e;
  undefined1 local_100 [8];
  LinkClosure linkClosure_1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  cmValue local_78;
  byte local_6d;
  bool hasHardCodedLinkerLanguage;
  undefined1 local_60 [8];
  LinkClosure linkClosure;
  bool secondPass;
  LinkClosure *lc_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  linkClosure.Languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  LinkClosure::LinkClosure((LinkClosure *)local_60);
  std::__cxx11::string::operator=((string *)local_60,(string *)&this->LinkerLanguage);
  pcVar1 = this->Target;
  std::allocator<char>::allocator();
  linkClosure_1.Languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  linkClosure_1.Languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"HAS_CXX",&local_99);
  local_78 = cmTarget::GetProperty(pcVar1,&local_98);
  bVar2 = cmValue::operator_cast_to_bool(&local_78);
  local_2c1 = 1;
  if (!bVar2) {
    pcVar1 = this->Target;
    std::allocator<char>::allocator();
    linkClosure_1.Languages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"LINKER_LANGUAGE",
               (allocator<char> *)
               ((long)&linkClosure_1.Languages.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    linkClosure_1.Languages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
    cmTarget::GetSafeProperty(pcVar1,&local_c0);
    local_2c1 = std::__cxx11::string::empty();
    local_2c1 = local_2c1 ^ 0xff;
  }
  if ((linkClosure_1.Languages.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c0);
  }
  if ((linkClosure_1.Languages.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&linkClosure_1.Languages.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  local_6d = local_2c1 & 1;
  bVar2 = ComputeLinkClosure(this,config,(LinkClosure *)local_60,false);
  local_2e3 = 0;
  if (bVar2) {
    local_2e3 = local_6d ^ 0xff;
  }
  linkClosure.Languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_2e3 & 1;
  std::__cxx11::string::operator=((string *)&this->LinkerLanguage,(string *)local_60);
  if ((linkClosure.Languages.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    LinkClosure::operator=(lc,(LinkClosure *)local_60);
  }
  LinkClosure::~LinkClosure((LinkClosure *)local_60);
  if ((linkClosure.Languages.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    LinkClosure::LinkClosure((LinkClosure *)local_100);
    ComputeLinkClosure(this,config,(LinkClosure *)local_100,
                       (bool)(linkClosure.Languages.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
    LinkClosure::operator=(lc,(LinkClosure *)local_100);
    bVar2 = std::operator!=(&this->LinkerLanguage,&lc->LinkerLanguage);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
      poVar3 = std::operator<<((ostream *)local_278,
                               "Evaluation of $<LINK_LANGUAGE:...> or $<LINK_LAND_AND_ID:...> changes\nthe linker language for target \""
                              );
      psVar4 = GetName_abi_cxx11_(this);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3,"\" (from \'");
      poVar3 = std::operator<<(poVar3,(string *)&this->LinkerLanguage);
      poVar3 = std::operator<<(poVar3,"\' to \'");
      poVar3 = std::operator<<(poVar3,(string *)lc);
      std::operator<<(poVar3,"\') which is invalid.");
      std::__cxx11::ostringstream::str();
      cmSystemTools::Error(&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
    }
    LinkClosure::~LinkClosure((LinkClosure *)local_100);
  }
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkClosure(const std::string& config,
                                           LinkClosure& lc) const
{
  bool secondPass = false;

  {
    LinkClosure linkClosure;
    linkClosure.LinkerLanguage = this->LinkerLanguage;

    bool hasHardCodedLinkerLanguage = this->Target->GetProperty("HAS_CXX") ||
      !this->Target->GetSafeProperty("LINKER_LANGUAGE").empty();

    // Get languages built in this target.
    secondPass = this->ComputeLinkClosure(config, linkClosure, false) &&
      !hasHardCodedLinkerLanguage;
    this->LinkerLanguage = linkClosure.LinkerLanguage;
    if (!secondPass) {
      lc = std::move(linkClosure);
    }
  }

  if (secondPass) {
    LinkClosure linkClosure;

    this->ComputeLinkClosure(config, linkClosure, secondPass);
    lc = std::move(linkClosure);

    // linker language must not be changed between the two passes
    if (this->LinkerLanguage != lc.LinkerLanguage) {
      std::ostringstream e;
      e << "Evaluation of $<LINK_LANGUAGE:...> or $<LINK_LAND_AND_ID:...> "
           "changes\nthe linker language for target \""
        << this->GetName() << "\" (from '" << this->LinkerLanguage << "' to '"
        << lc.LinkerLanguage << "') which is invalid.";
      cmSystemTools::Error(e.str());
    }
  }
}